

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsCopyStringOneByte(JsValueRef value,int start,int length,char *buffer,size_t *written)

{
  JsErrorCode JVar1;
  char16 *pcVar2;
  ulong uVar3;
  ulong uVar4;
  WCHAR *local_38;
  char16 *str;
  
  if (value != (JsValueRef)0x0) {
    if (written != (size_t *)0x0) {
      *written = 0;
    }
    local_38 = (WCHAR *)0x0;
    str = (char16 *)0x0;
    JVar1 = JsStringToPointer(value,&local_38,(size_t *)&str);
    if ((JVar1 == JsNoError) && (JVar1 = JsErrorInvalidArgument, -1 < start)) {
      pcVar2 = (char16 *)(ulong)(uint)start;
      if (pcVar2 <= str) {
        uVar3 = (long)length;
        if ((ulong)((long)str - (long)pcVar2) < (ulong)(long)length) {
          uVar3 = (long)str - (long)pcVar2;
        }
        JVar1 = JsNoError;
        if (uVar3 != 0) {
          if (buffer != (char *)0x0) {
            uVar4 = 0;
            do {
              buffer[uVar4] = (char)local_38[(long)pcVar2 + uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (written != (size_t *)0x0) {
            *written = uVar3;
          }
        }
      }
    }
    return JVar1;
  }
  return JsErrorNullArgument;
}

Assistant:

CHAKRA_API JsCopyStringOneByte(
    _In_ JsValueRef value,
    _In_ int start,
    _In_ int length,
    _Out_opt_ char* buffer,
    _Out_opt_ size_t* written)
{
    PARAM_NOT_NULL(value);
    VALIDATE_JSREF(value);
    return WriteStringCopy(value, start, length, written,
        [buffer](const char16* src, size_t count, size_t *needed)
    {
        if (buffer)
        {
            for (size_t i = 0; i < count; i++)
            {
                buffer[i] = (char)src[i];
            }
        }
        return JsNoError;
    });
}